

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelativeWorldCoordinates.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::RelativeWorldCoordinates::operator==
          (RelativeWorldCoordinates *this,RelativeWorldCoordinates *Value)

{
  KBOOL KVar1;
  KFIXED<short,_(unsigned_char)__x03_> local_60;
  KFIXED<short,_(unsigned_char)__x03_> local_50 [2];
  KFIXED<short,_(unsigned_char)__x03_> local_30;
  RelativeWorldCoordinates *local_20;
  RelativeWorldCoordinates *Value_local;
  RelativeWorldCoordinates *this_local;
  
  if (this->m_ui16RefPnt == Value->m_ui16RefPnt) {
    local_20 = Value;
    Value_local = this;
    KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(&local_30,&Value->m_DelX);
    KVar1 = KFIXED<short,_(unsigned_char)'\x03'>::operator!=(&this->m_DelX,&local_30);
    KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_30);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(local_50,&local_20->m_DelY);
      KVar1 = KFIXED<short,_(unsigned_char)'\x03'>::operator!=(&this->m_DelY,local_50);
      KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(local_50);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(&local_60,&local_20->m_DelZ);
        KVar1 = KFIXED<short,_(unsigned_char)'\x03'>::operator!=(&this->m_DelZ,&local_60);
        KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_60);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL RelativeWorldCoordinates::operator == ( const RelativeWorldCoordinates  & Value ) const
{
    if( m_ui16RefPnt != Value.m_ui16RefPnt ) return false;
    if( m_DelX       != Value.m_DelX )       return false;
    if( m_DelY       != Value.m_DelY )       return false;
    if( m_DelZ       != Value.m_DelZ )       return false;
    return true;
}